

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

uint read_buf(z_streamp strm,Bytef *buf,uint size)

{
  uint uVar1;
  int iVar2;
  uLong uVar3;
  ulong __n;
  
  uVar1 = strm->avail_in;
  if (uVar1 < size) {
    size = uVar1;
  }
  if (size == 0) {
    return 0;
  }
  strm->avail_in = uVar1 - size;
  __n = (ulong)size;
  memcpy(buf,strm->next_in,__n);
  iVar2 = strm->state->wrap;
  if (iVar2 == 2) {
    uVar3 = crc32(strm->adler,buf,size);
  }
  else {
    if (iVar2 != 1) goto LAB_002dd6db;
    uVar3 = adler32(strm->adler,buf,size);
  }
  strm->adler = uVar3;
LAB_002dd6db:
  strm->next_in = strm->next_in + __n;
  strm->total_in = strm->total_in + __n;
  return size;
}

Assistant:

local unsigned read_buf(strm, buf, size)
    z_streamp strm;
    Bytef *buf;
    unsigned size;
{
    unsigned len = strm->avail_in;

    if (len > size) len = size;
    if (len == 0) return 0;

    strm->avail_in  -= len;

    zmemcpy(buf, strm->next_in, len);
    if (strm->state->wrap == 1) {
        strm->adler = adler32(strm->adler, buf, len);
    }
#ifdef GZIP
    else if (strm->state->wrap == 2) {
        strm->adler = crc32(strm->adler, buf, len);
    }
#endif
    strm->next_in  += len;
    strm->total_in += len;

    return len;
}